

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

void destroy_all_streams(quicly_conn_t *conn,int err,int including_crypto_streams)

{
  kh_quicly_stream_t_t *pkVar1;
  _st_quicly_conn_public_t *c;
  uint uVar2;
  byte bVar3;
  
  pkVar1 = conn->streams;
  if (pkVar1->n_buckets != 0) {
    bVar3 = 0;
    uVar2 = 0;
    do {
      if (((pkVar1->flags[uVar2 >> 4] >> (bVar3 & 0x1e) & 3) == 0) &&
         ((including_crypto_streams != 0 || (-1 < pkVar1->vals[uVar2]->stream_id)))) {
        destroy_stream(pkVar1->vals[uVar2],err);
      }
      uVar2 = uVar2 + 1;
      pkVar1 = conn->streams;
      bVar3 = bVar3 + 2;
    } while (uVar2 != pkVar1->n_buckets);
  }
  if ((conn->super).local.uni.num_streams + (conn->super).local.bidi.num_streams +
      (conn->super).remote.bidi.num_streams + (conn->super).remote.uni.num_streams == 0) {
    return;
  }
  __assert_fail("quicly_num_streams(conn) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                ,0x483,"void destroy_all_streams(quicly_conn_t *, int, int)");
}

Assistant:

static void destroy_all_streams(quicly_conn_t *conn, int err, int including_crypto_streams)
{
    quicly_stream_t *stream;
    kh_foreach_value(conn->streams, stream, {
        /* TODO do we need to send reset signals to open streams? */
        if (including_crypto_streams || stream->stream_id >= 0)
            destroy_stream(stream, err);
    });
    assert(quicly_num_streams(conn) == 0);
}